

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O1

IndexPropertyDescriptorMap * __thiscall
Js::IndexPropertyDescriptorMap::Clone(IndexPropertyDescriptorMap *this,Recycler *recycler)

{
  Recycler *alloc;
  IndexPropertyDescriptorMap *this_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  local_48 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9b91433;
  data.filename._0_4_ = 0x1a;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_48);
  this_00 = (IndexPropertyDescriptorMap *)new<Memory::Recycler>(0x20,alloc,0x38bbb2);
  IndexPropertyDescriptorMap(this_00,recycler,this);
  return this_00;
}

Assistant:

IndexPropertyDescriptorMap * IndexPropertyDescriptorMap::Clone(Recycler * recycler)
    {
        return RecyclerNew(recycler, IndexPropertyDescriptorMap, recycler, this);
    }